

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

shared_ptr<libtorrent::torrent_info> __thiscall
libtorrent::aux::torrent::get_torrent_copy_with_hashes(torrent *this)

{
  merkle_tree *pmVar1;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> _Var2;
  pointer pdVar3;
  bool bVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  pointer this_00;
  long in_RSI;
  merkle_tree *this_01;
  shared_ptr<libtorrent::torrent_info> sVar5;
  shared_ptr<libtorrent::torrent_info> ret;
  vector<aux::vector<char>,_file_index_t> v2_hashes;
  vector<char,_std::allocator<char>_> out_layer;
  torrent_info *local_a8;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> _Stack_a0;
  vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
  local_98;
  _Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> local_80;
  _Vector_base<char,_std::allocator<char>_> local_68;
  merkle_tree *local_50;
  vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
  local_48;
  
  if (**(int **)(in_RSI + 0x18) < 1) {
    (this->super_request_callback)._vptr_request_callback = (_func_int **)0x0;
    (this->super_torrent_hot_members).m_picker._M_t.
    super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
    ._M_t.
    super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
    .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl =
         (piece_picker *)0x0;
  }
  else {
    ::std::make_shared<libtorrent::torrent_info,libtorrent::torrent_info&>
              ((torrent_info *)&local_a8);
    bVar4 = torrent_info::v2(local_a8);
    if (bVar4) {
      local_98.
      super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.
      super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.
      super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pmVar1 = *(merkle_tree **)(in_RSI + 0x400);
      this_01 = *(merkle_tree **)(in_RSI + 0x3f8);
      while (this_01 != pmVar1) {
        local_50 = this_01;
        merkle_tree::get_piece_layer((vector<sha256_hash> *)&local_80,this_01);
        local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ::std::vector<char,_std::allocator<char>_>::reserve
                  ((vector<char,_std::allocator<char>_> *)&local_68,
                   (long)local_80._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_80._M_impl.super__Vector_impl_data._M_start);
        pdVar3 = local_80._M_impl.super__Vector_impl_data._M_finish;
        this_00 = local_80._M_impl.super__Vector_impl_data._M_start;
        while (this_00 != pdVar3) {
          bVar4 = digest32<256L>::is_all_zeros(this_00);
          if (bVar4) {
            (this->super_request_callback)._vptr_request_callback = (_func_int **)0x0;
            (this->super_torrent_hot_members).m_picker._M_t.
            super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
            ._M_t.
            super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
            .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl =
                 (piece_picker *)0x0;
            ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_68);
            ::std::
            _Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
            ~_Vector_base(&local_80);
            ::std::
            vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
            ::~vector(&local_98);
            goto LAB_002e1156;
          }
          ::std::vector<char,std::allocator<char>>::insert<char_const*,void>
                    ((vector<char,std::allocator<char>> *)&local_68,
                     (const_iterator)local_68._M_impl.super__Vector_impl_data._M_finish,
                     (char *)this_00,(char *)(this_00 + 1));
          this_00 = this_00 + 1;
        }
        ::std::
        vector<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>,std::allocator<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>>>
        ::emplace_back<std::vector<char,std::allocator<char>>>
                  ((vector<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>,std::allocator<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>>>
                    *)&local_98,(vector<char,_std::allocator<char>_> *)&local_68);
        ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_68);
        ::std::
        _Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
        ~_Vector_base(&local_80);
        this_01 = local_50 + 1;
      }
      local_48.
      super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_98.
           super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_48.
      super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_98.
           super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_48.
      super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_98.
           super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_98.
      super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.
      super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.
      super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      torrent_info::set_piece_layers(local_a8,(vector<aux::vector<char>,_file_index_t> *)&local_48);
      ::std::
      vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
      ::~vector(&local_48);
      ::std::
      vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
      ::~vector(&local_98);
    }
    _Var2._M_head_impl = _Stack_a0._M_head_impl;
    _Stack_a0._M_head_impl = (piece_picker *)0x0;
    (this->super_request_callback)._vptr_request_callback = (_func_int **)local_a8;
    (this->super_torrent_hot_members).m_picker._M_t.
    super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
    ._M_t.
    super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
    .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl = _Var2._M_head_impl
    ;
    local_a8 = (torrent_info *)0x0;
LAB_002e1156:
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_a0);
    in_RDX._M_pi = extraout_RDX;
  }
  sVar5.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar5.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<libtorrent::torrent_info>)
         sVar5.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<torrent_info> torrent::get_torrent_copy_with_hashes() const
	{
		if (!m_torrent_file->is_valid()) return {};
		auto ret = std::make_shared<torrent_info>(*m_torrent_file);

		if (ret->v2())
		{
			aux::vector<aux::vector<char>, file_index_t> v2_hashes;
			for (auto const& tree : m_merkle_trees)
			{
				auto const& layer = tree.get_piece_layer();
				std::vector<char> out_layer;
				out_layer.reserve(layer.size() * sha256_hash::size());
				for (auto const& h : layer)
				{
					// we're missing a piece layer. We can't return a valid
					// torrent
					if (h.is_all_zeros()) return {};
					out_layer.insert(out_layer.end(), h.data(), h.data() + sha256_hash::size());
				}
				v2_hashes.emplace_back(std::move(out_layer));
			}
			ret->set_piece_layers(std::move(v2_hashes));
		}

		return ret;
	}